

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

void opn2_setDebugMessageHook
               (OPN2_MIDIPlayer *device,OPN2_DebugMessageHook debugMessageHook,void *userData)

{
  void *pvVar1;
  MidiPlayer *play;
  void *userData_local;
  OPN2_DebugMessageHook debugMessageHook_local;
  OPN2_MIDIPlayer *device_local;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    pvVar1 = device->opn2_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x3cb,
                    "void opn2_setDebugMessageHook(struct OPN2_MIDIPlayer *, OPN2_DebugMessageHook, void *)"
                   );
    }
    *(OPN2_DebugMessageHook *)((long)pvVar1 + 0x50) = debugMessageHook;
    *(void **)((long)pvVar1 + 0x58) = userData;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setDebugMessageHook(struct OPN2_MIDIPlayer *device, OPN2_DebugMessageHook debugMessageHook, void *userData)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->hooks.onDebugMessage = debugMessageHook;
    play->hooks.onDebugMessage_userData = userData;
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    play->m_sequencerInterface->onDebugMessage = debugMessageHook;
    play->m_sequencerInterface->onDebugMessage_userData = userData;
#endif
}